

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_opt.hpp
# Opt level: O0

handle * __thiscall
gmlc::libguarded::
shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
::lock(shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
       *this)

{
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *in_RSI;
  pointer in_RDI;
  pointer in_stack_ffffffffffffffa8;
  pointer val;
  unique_lock<std::mutex> local_20 [2];
  
  if (((ulong)in_RSI[10].data & 1) == 0) {
    val = in_RDI;
    std::unique_lock<std::mutex>::unique_lock(local_20);
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock_handle(in_RSI,val,(unique_lock<std::mutex> *)in_RDI);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_RDI);
  }
  else {
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                   *)in_RDI,in_stack_ffffffffffffffa8,(mutex *)0x29e48d);
    val = in_RDI;
  }
  return (handle *)val;
}

Assistant:

auto shared_guarded_opt<T, M>::lock() -> handle
{
    return (enabled) ? handle(&m_obj, m_mutex) :
                       handle(&m_obj, std::unique_lock<M>());
}